

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

_Bool parse_vrplib_edge_weight_section(VrplibParser *p,Instance *instance)

{
  uint uVar1;
  _Bool _Var2;
  _Bool _Var3;
  uint uVar4;
  uint uVar5;
  char *lexeme;
  uint uVar6;
  uint uVar7;
  uint node_id;
  int iVar8;
  uint uVar9;
  bool bVar10;
  double value;
  uint local_5c;
  double local_40;
  Instance *local_38;
  
  if (p->edgew_format == EDGE_WEIGHT_FORMAT_EXPLICIT) {
    if (instance->edge_weight == (double *)0x0) {
      __assert_fail("instance->edge_weight",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/parser.c"
                    ,0x261,"_Bool parse_vrplib_edge_weight_section(VrplibParser *, Instance *)");
    }
    uVar1 = instance->num_customers;
    uVar6 = 0xffffffff;
    if (-1 < (int)uVar1) {
      uVar6 = uVar1;
    }
    _Var3 = true;
    local_5c = 0;
    local_38 = instance;
    do {
      if (local_5c == uVar6 + 1) {
        return _Var3;
      }
      uVar4 = local_5c + 1;
      uVar9 = uVar4;
      if ((int)local_5c < (int)uVar1) {
        do {
          if (local_5c == uVar9) {
            __assert_fail("i != j",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/core-utils.h"
                          ,0x2c,"int64_t sxpos(int32_t, int32_t, int32_t)");
          }
          uVar5 = uVar9;
          if ((int)local_5c < (int)uVar9) {
            uVar5 = local_5c;
          }
          uVar7 = uVar9;
          if ((int)uVar9 < (int)local_5c) {
            uVar7 = local_5c;
          }
          iVar8 = 3;
          do {
            lexeme = get_token_lexeme(p);
            if (iVar8 == 1) {
              local_40 = 0.0;
              _Var2 = str_to_double(lexeme,&local_40);
              if (_Var2) {
                local_38->edge_weight
                [(int)((uVar5 * (uVar1 + 1) + uVar7) - ((uVar5 + 2) * (uVar5 + 1) >> 1))] = local_40
                ;
              }
              else {
                _Var3 = false;
                parse_error(p,"Expected valid double for reduced cost");
              }
            }
            else {
              node_id = uVar9;
              if (iVar8 == 3) {
                node_id = local_5c;
              }
              _Var3 = parse_node_id(p,lexeme,node_id);
            }
            if (lexeme != (char *)0x0) {
              free(lexeme);
            }
            if (_Var3 == false) {
              iVar8 = 0xb;
              goto LAB_0010411e;
            }
            iVar8 = iVar8 + -1;
          } while (iVar8 != 0);
          iVar8 = 8;
LAB_0010411e:
          if (_Var3 != false) {
            _Var2 = parser_match_newline(p);
            iVar8 = 0;
            if (!_Var2) {
              _Var3 = false;
              parse_error(p,"Expected newline after reduced cost for arc `(%d, %d)``",(ulong)uVar4,
                          (ulong)(uVar9 + 1));
              iVar8 = 0xb;
            }
          }
          if (iVar8 != 0) goto LAB_00104176;
          bVar10 = uVar9 != uVar1;
          uVar9 = uVar9 + 1;
        } while (bVar10);
      }
      iVar8 = 5;
LAB_00104176:
      local_5c = uVar4;
    } while (iVar8 == 5);
  }
  else {
    _Var3 = false;
    parse_error(p,
                "Found un-expected `EDGE_WEIGHT_SECTION`. EDGE_WEIGHT_TYPE should be set accordingly"
               );
  }
  return _Var3;
}

Assistant:

static bool parse_vrplib_edge_weight_section(VrplibParser *p,
                                             Instance *instance) {
    bool result = true;
    int32_t n = instance->num_customers + 1;

    bool needs_edge_section = parser_needs_edge_section(p);
    if (!needs_edge_section) {
        parse_error(p, "Found un-expected `EDGE_WEIGHT_SECTION`. "
                       "EDGE_WEIGHT_TYPE should be set accordingly");
        return false;
    }

    assert(instance->edge_weight);

    for (int32_t i = 0; i < n; i++) {
        for (int32_t j = i + 1; j < n; j++) {
            int32_t idx = sxpos(n, i, j);

            for (int32_t lexid = 0; lexid < 3; lexid++) {
                char *lexeme = get_token_lexeme(p);
                if (lexid == 0 || lexid == 1) {
                    result = parse_node_id(p, lexeme, lexid == 0 ? i : j);
                } else {
                    // Parse the reduced cost variable
                    double value = 0;
                    if (!str_to_double(lexeme, &value)) {
                        parse_error(p,
                                    "Expected valid double for reduced cost");
                        result = false;
                    } else {
                        instance->edge_weight[idx] = value;
                    }
                }

                if (lexeme) {
                    free(lexeme);
                }

                if (!result) {
                    goto terminate;
                }
            }

            if (!parser_match_newline(p)) {
                parse_error(p,
                            "Expected newline after reduced cost for arc "
                            "`(%d, %d)``",
                            i + 1, j + 1);
                result = false;
                goto terminate;
            }
        }
    }

terminate:
    return result;
}